

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x219;
  uint64_t x218;
  uint64_t x217;
  uint64_t x216;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x215;
  uint64_t x214;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x213;
  uint64_t x212;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x211;
  uint64_t x210;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x209;
  uint64_t x208;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x207;
  uint64_t x206;
  uint64_t x205;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x204;
  uint64_t x203;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x202;
  uint64_t x201;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x200;
  uint64_t x199;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
  uint64_t x197;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
  uint64_t x195;
  uint64_t x194;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x193;
  uint64_t x192;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x191;
  uint64_t x190;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x189;
  uint64_t x188;
  uint64_t x187;
  uint64_t x186;
  uint64_t x185;
  uint64_t x184;
  uint64_t x183;
  uint64_t x182;
  uint64_t x181;
  uint64_t x180;
  uint64_t x179;
  uint64_t x178;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x177;
  uint64_t x176;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x175;
  uint64_t x174;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x173;
  uint64_t x172;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x171;
  uint64_t x170;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x169;
  uint64_t x168;
  uint64_t x167;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x166;
  uint64_t x165;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x164;
  uint64_t x163;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
  uint64_t x161;
  uint64_t x160;
  uint64_t x159;
  uint64_t x158;
  uint64_t x157;
  uint64_t x156;
  uint64_t x155;
  uint64_t x154;
  uint64_t x153;
  uint64_t x152;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x151;
  uint64_t x150;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x149;
  uint64_t x148;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x147;
  uint64_t x146;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x145;
  uint64_t x144;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x143;
  uint64_t x142;
  uint64_t x141;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
  uint64_t x139;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
  uint64_t x137;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
  uint64_t x135;
  uint64_t x134;
  uint64_t x133;
  uint64_t x132;
  uint64_t x131;
  uint64_t x130;
  uint64_t x129;
  uint64_t x128;
  uint64_t x127;
  uint64_t x126;
  uint64_t x125;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
  uint64_t x123;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
  uint64_t x121;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
  uint64_t x119;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
  uint64_t x117;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x116;
  uint64_t x115;
  uint64_t x114;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
  uint64_t x112;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
  uint64_t x110;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
  uint64_t x108;
  uint64_t x107;
  uint64_t x106;
  uint64_t x105;
  uint64_t x104;
  uint64_t x103;
  uint64_t x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x98;
  uint64_t x97;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x96;
  uint64_t x95;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x94;
  uint64_t x93;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
  uint64_t x91;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
  uint64_t x89;
  uint64_t x88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
  uint64_t x86;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
  uint64_t x84;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
  uint64_t x82;
  uint64_t x81;
  uint64_t x80;
  uint64_t x79;
  uint64_t x78;
  uint64_t x77;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  uint64_t x72;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x71;
  uint64_t x70;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x69;
  uint64_t x68;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x67;
  uint64_t x66;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x65;
  uint64_t x64;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x63;
  uint64_t x62;
  uint64_t x61;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
  uint64_t x59;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
  uint64_t x57;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
  uint64_t x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x46;
  uint64_t x45;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
  uint64_t x43;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
  uint64_t x41;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
  uint64_t x39;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
  uint64_t x37;
  uint64_t x36;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x35;
  uint64_t x34;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x33;
  uint64_t x32;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
  uint64_t x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
  uint64_t x17;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  uint64_t in_stack_fffffffffffff938;
  uint64_t in_stack_fffffffffffff940;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffff94f;
  uint64_t *in_stack_fffffffffffff950;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_6a1;
  uint64_t local_6a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_691;
  uint64_t local_690;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_681;
  uint64_t local_680;
  uint64_t local_678;
  byte local_669;
  uint64_t local_668;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_659;
  uint64_t local_658;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_649;
  uint64_t local_648;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_639;
  uint64_t local_638;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_629;
  uint64_t local_628;
  uint64_t local_620;
  byte local_611;
  uint64_t local_610;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_601;
  uint64_t local_600;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5f1;
  uint64_t local_5f0;
  uint64_t local_5e8;
  uint64_t local_5e0;
  uint64_t local_5d8;
  uint64_t local_5d0;
  uint64_t local_5c8;
  uint64_t local_5c0;
  uint64_t local_5b8;
  uint64_t local_5b0;
  uint64_t local_5a8;
  uint64_t local_5a0;
  byte local_591;
  uint64_t local_590;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_581;
  uint64_t local_580;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_571;
  uint64_t local_570;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_561;
  uint64_t local_560;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_551;
  uint64_t local_550;
  uint64_t local_548;
  byte local_539;
  uint64_t local_538;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_529;
  uint64_t local_528;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_519;
  uint64_t local_518;
  uint64_t local_510;
  uint64_t local_508;
  uint64_t local_500;
  uint64_t local_4f8;
  uint64_t local_4f0;
  uint64_t local_4e8;
  uint64_t local_4e0;
  uint64_t local_4d8;
  uint64_t local_4d0;
  byte local_4c1;
  uint64_t local_4c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4b1;
  uint64_t local_4b0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4a1;
  uint64_t local_4a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_491;
  uint64_t local_490;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_481;
  uint64_t local_480;
  uint64_t local_478;
  byte local_469;
  uint64_t local_468;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_459;
  uint64_t local_458;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_449;
  uint64_t local_448;
  uint64_t local_440;
  uint64_t local_438;
  uint64_t local_430;
  uint64_t local_428;
  uint64_t local_420;
  uint64_t local_418;
  uint64_t local_410;
  uint64_t local_408;
  uint64_t local_400;
  uint64_t local_3f8;
  byte local_3e9;
  uint64_t local_3e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3d9;
  uint64_t local_3d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3c9;
  uint64_t local_3c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3b9;
  uint64_t local_3b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3a9;
  uint64_t local_3a8;
  uint64_t local_3a0;
  byte local_391;
  uint64_t local_390;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_381;
  uint64_t local_380;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_371;
  uint64_t local_370;
  uint64_t local_368;
  uint64_t local_360;
  uint64_t local_358;
  uint64_t local_350;
  uint64_t local_348;
  uint64_t local_340;
  uint64_t local_338;
  uint64_t local_330;
  uint64_t local_328;
  byte local_319;
  uint64_t local_318;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_309;
  uint64_t local_308;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2f9;
  uint64_t local_2f8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2e9;
  uint64_t local_2e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2d9;
  uint64_t local_2d8;
  uint64_t local_2d0;
  byte local_2c1;
  uint64_t local_2c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2b1;
  uint64_t local_2b0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2a1;
  uint64_t local_2a0;
  uint64_t local_298;
  uint64_t local_290;
  uint64_t local_288;
  uint64_t local_280;
  uint64_t local_278;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  uint64_t local_258;
  uint64_t local_250;
  byte local_241;
  uint64_t local_240;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_231;
  uint64_t local_230;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_221;
  uint64_t local_220;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_211;
  uint64_t local_210;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_201;
  uint64_t local_200;
  uint64_t local_1f8;
  byte local_1e9;
  uint64_t local_1e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1d9;
  uint64_t local_1d8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1c9;
  uint64_t local_1c8;
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  uint64_t local_188;
  byte local_179;
  uint64_t local_178;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_169;
  uint64_t local_168;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_159;
  uint64_t local_158;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_149;
  uint64_t local_148;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_139;
  uint64_t local_138;
  uint64_t local_130;
  byte local_121;
  uint64_t local_120;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_111;
  uint64_t local_110;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_101;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  byte local_99;
  uint64_t local_98;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_89;
  uint64_t local_88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_79;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_18 = in_RSI[1];
  local_20 = in_RSI[2];
  local_28 = in_RSI[3];
  local_30 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_38,&local_40,local_30,in_RSI[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_48,&local_50,local_30,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_58,&local_60,local_30,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_68,&local_70,local_30,*local_10);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_78,&local_79,'\0',local_70,local_58);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_88,&local_89,local_79,local_60,local_48);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_98,&local_99,local_89,local_50,local_38);
  local_a8 = local_99 + local_40;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_b0,&local_b8,local_68,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_c0,&local_c8,local_b0,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_d0,&local_d8,local_b0,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_e0,&local_e8,local_b0,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_f0,&local_f8,local_b0,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_100,&local_101,'\0',local_f8,local_e0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_110,&local_111,local_101,local_e8,local_d0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_120,&local_121,local_111,local_d8,local_c0);
  local_130 = local_121 + local_c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_138,&local_139,'\0',local_68,local_f0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_148,&local_149,local_139,local_78,local_100);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_158,&local_159,local_149,local_88,local_110);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_168,&local_169,local_159,local_98,local_120);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_178,&local_179,local_169,local_a8,local_130);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_188,&local_190,local_18,local_10[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_198,&local_1a0,local_18,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_1a8,&local_1b0,local_18,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_1b8,&local_1c0,local_18,*local_10);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1c8,&local_1c9,'\0',local_1c0,local_1a8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1d8,&local_1d9,local_1c9,local_1b0,local_198);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1e8,&local_1e9,local_1d9,local_1a0,local_188);
  local_1f8 = local_1e9 + local_190;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_200,&local_201,'\0',local_148,local_1b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_210,&local_211,local_201,local_158,local_1c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_220,&local_221,local_211,local_168,local_1d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_230,&local_231,local_221,local_178,local_1e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_240,&local_241,local_231,(ulong)local_179,local_1f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_250,&local_258,local_200,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_260,&local_268,local_250,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_270,&local_278,local_250,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_280,&local_288,local_250,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_290,&local_298,local_250,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2a0,&local_2a1,'\0',local_298,local_280);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2b0,&local_2b1,local_2a1,local_288,local_270);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2c0,&local_2c1,local_2b1,local_278,local_260);
  local_2d0 = local_2c1 + local_268;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2d8,&local_2d9,'\0',local_200,local_290);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2e8,&local_2e9,local_2d9,local_210,local_2a0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2f8,&local_2f9,local_2e9,local_220,local_2b0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_308,&local_309,local_2f9,local_230,local_2c0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_318,&local_319,local_309,local_240,local_2d0);
  local_328 = (ulong)local_319 + (ulong)local_241;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_330,&local_338,local_20,local_10[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_340,&local_348,local_20,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_350,&local_358,local_20,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_360,&local_368,local_20,*local_10);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_370,&local_371,'\0',local_368,local_350);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_380,&local_381,local_371,local_358,local_340);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_390,&local_391,local_381,local_348,local_330);
  local_3a0 = local_391 + local_338;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3a8,&local_3a9,'\0',local_2e8,local_360);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3b8,&local_3b9,local_3a9,local_2f8,local_370);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3c8,&local_3c9,local_3b9,local_308,local_380);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3d8,&local_3d9,local_3c9,local_318,local_390);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3e8,&local_3e9,local_3d9,local_328,local_3a0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_3f8,&local_400,local_3a8,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_408,&local_410,local_3f8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_418,&local_420,local_3f8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_428,&local_430,local_3f8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_438,&local_440,local_3f8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_448,&local_449,'\0',local_440,local_428);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_458,&local_459,local_449,local_430,local_418);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_468,&local_469,local_459,local_420,local_408);
  local_478 = local_469 + local_410;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_480,&local_481,'\0',local_3a8,local_438);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_490,&local_491,local_481,local_3b8,local_448);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4a0,&local_4a1,local_491,local_3c8,local_458);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4b0,&local_4b1,local_4a1,local_3d8,local_468);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4c0,&local_4c1,local_4b1,local_3e8,local_478);
  local_4d0 = (ulong)local_4c1 + (ulong)local_3e9;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_4d8,&local_4e0,local_28,local_10[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_4e8,&local_4f0,local_28,local_10[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_4f8,&local_500,local_28,local_10[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_508,&local_510,local_28,*local_10);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_518,&local_519,'\0',local_510,local_4f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_528,&local_529,local_519,local_500,local_4e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_538,&local_539,local_529,local_4f0,local_4d8);
  local_548 = local_539 + local_4e0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_550,&local_551,'\0',local_490,local_508);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_560,&local_561,local_551,local_4a0,local_518);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_570,&local_571,local_561,local_4b0,local_528);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_580,&local_581,local_571,local_4c0,local_538);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_590,&local_591,local_581,local_4d0,local_548);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5a0,&local_5a8,local_550,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5b0,&local_5b8,local_5a0,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5c0,&local_5c8,local_5a0,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5d0,&local_5d8,local_5a0,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5e0,&local_5e8,local_5a0,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5f0,&local_5f1,'\0',local_5e8,local_5d0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_600,&local_601,local_5f1,local_5d8,local_5c0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_610,&local_611,local_601,local_5c8,local_5b0);
  local_620 = local_611 + local_5b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_628,&local_629,'\0',local_550,local_5e0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_638,&local_639,local_629,local_560,local_5f0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_648,&local_649,local_639,local_570,local_600);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_658,&local_659,local_649,local_580,local_610);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_668,&local_669,local_659,local_590,local_620);
  local_678 = (ulong)local_669 + (ulong)local_591;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_680,&local_681,'\0',local_638,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_690,&local_691,local_681,local_648,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_6a0,&local_6a1,local_691,local_658,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffff950,&stack0xfffffffffffff94f,local_6a1,local_668,
             0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffff940,&stack0xfffffffffffff93f,in_stack_fffffffffffff94f
             ,local_678,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94f,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94f,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94f,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            (in_stack_fffffffffffff950,in_stack_fffffffffffff94f,in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  *local_8 = local_6d0;
  local_8[1] = local_6d8;
  local_8[2] = local_6e0;
  local_8[3] = local_6e8;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
    uint64_t x32;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
    uint64_t x45;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
    uint64_t x61;
    uint64_t x62;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x63;
    uint64_t x64;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x65;
    uint64_t x66;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x67;
    uint64_t x68;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x69;
    uint64_t x70;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
    uint64_t x84;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
    uint64_t x88;
    uint64_t x89;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
    uint64_t x91;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
    uint64_t x93;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x94;
    uint64_t x95;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x96;
    uint64_t x97;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
    uint64_t x110;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
    uint64_t x112;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
    uint64_t x114;
    uint64_t x115;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
    uint64_t x119;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
    uint64_t x121;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
    uint64_t x123;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint64_t x128;
    uint64_t x129;
    uint64_t x130;
    uint64_t x131;
    uint64_t x132;
    uint64_t x133;
    uint64_t x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
    uint64_t x141;
    uint64_t x142;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x143;
    uint64_t x144;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x145;
    uint64_t x146;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x147;
    uint64_t x148;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x149;
    uint64_t x150;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x151;
    uint64_t x152;
    uint64_t x153;
    uint64_t x154;
    uint64_t x155;
    uint64_t x156;
    uint64_t x157;
    uint64_t x158;
    uint64_t x159;
    uint64_t x160;
    uint64_t x161;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
    uint64_t x163;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x164;
    uint64_t x165;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x166;
    uint64_t x167;
    uint64_t x168;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x169;
    uint64_t x170;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x171;
    uint64_t x172;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x173;
    uint64_t x174;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x175;
    uint64_t x176;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x177;
    uint64_t x178;
    uint64_t x179;
    uint64_t x180;
    uint64_t x181;
    uint64_t x182;
    uint64_t x183;
    uint64_t x184;
    uint64_t x185;
    uint64_t x186;
    uint64_t x187;
    uint64_t x188;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x189;
    uint64_t x190;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x191;
    uint64_t x192;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x193;
    uint64_t x194;
    uint64_t x195;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
    uint64_t x197;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
    uint64_t x199;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x200;
    uint64_t x201;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x202;
    uint64_t x203;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x204;
    uint64_t x205;
    uint64_t x206;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x207;
    uint64_t x208;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x209;
    uint64_t x210;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x211;
    uint64_t x212;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x213;
    uint64_t x214;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x215;
    uint64_t x216;
    uint64_t x217;
    uint64_t x218;
    uint64_t x219;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x5, &x6, x4,
                                                         (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x7, &x8, x4,
                                                         (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x9, &x10, x4,
                                                         (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x11, &x12, x4,
                                                         (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    x19 = (x18 + x6);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x20, &x21, x11, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x22, &x23, x20, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x24, &x25, x20, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x26, &x27, x20, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x28, &x29, x20, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x30, &x31, 0x0,
                                                              x29, x26);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x32, &x33, x31,
                                                              x27, x24);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x34, &x35, x33,
                                                              x25, x22);
    x36 = (x35 + x23);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x37, &x38, 0x0,
                                                              x11, x28);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x39, &x40, x38,
                                                              x13, x30);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x15, x32);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x43, &x44, x42,
                                                              x17, x34);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x45, &x46, x44,
                                                              x19, x36);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x47, &x48, x1,
                                                         (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x49, &x50, x1,
                                                         (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x51, &x52, x1,
                                                         (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x53, &x54, x1,
                                                         (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x55, &x56, 0x0,
                                                              x54, x51);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x52, x49);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x59, &x60, x58,
                                                              x50, x47);
    x61 = (x60 + x48);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x62, &x63, 0x0,
                                                              x39, x53);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x64, &x65, x63,
                                                              x41, x55);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x66, &x67, x65,
                                                              x43, x57);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x68, &x69, x67,
                                                              x45, x59);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x70, &x71, x69,
                                                              x46, x61);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x72, &x73, x62, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x74, &x75, x72, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x76, &x77, x72, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x78, &x79, x72, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x80, &x81, x72, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x82, &x83, 0x0,
                                                              x81, x78);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x84, &x85, x83,
                                                              x79, x76);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x86, &x87, x85,
                                                              x77, x74);
    x88 = (x87 + x75);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x89, &x90, 0x0,
                                                              x62, x80);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x91, &x92, x90,
                                                              x64, x82);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x93, &x94, x92,
                                                              x66, x84);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x95, &x96, x94,
                                                              x68, x86);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x97, &x98, x96,
                                                              x70, x88);
    x99 = ((uint64_t)x98 + x71);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x100, &x101, x2,
                                                         (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x102, &x103, x2,
                                                         (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x104, &x105, x2,
                                                         (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x106, &x107, x2,
                                                         (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x108, &x109, 0x0,
                                                              x107, x104);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x110, &x111,
                                                              x109, x105, x102);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x112, &x113,
                                                              x111, x103, x100);
    x114 = (x113 + x101);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x115, &x116, 0x0,
                                                              x91, x106);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x117, &x118,
                                                              x116, x93, x108);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x119, &x120,
                                                              x118, x95, x110);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x121, &x122,
                                                              x120, x97, x112);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x123, &x124,
                                                              x122, x99, x114);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x125, &x126, x115, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x127, &x128, x125, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x129, &x130, x125, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x131, &x132, x125, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x133, &x134, x125, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x135, &x136, 0x0,
                                                              x134, x131);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x132, x129);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x139, &x140,
                                                              x138, x130, x127);
    x141 = (x140 + x128);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x142, &x143, 0x0,
                                                              x115, x133);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x144, &x145,
                                                              x143, x117, x135);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x146, &x147,
                                                              x145, x119, x137);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x148, &x149,
                                                              x147, x121, x139);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x150, &x151,
                                                              x149, x123, x141);
    x152 = ((uint64_t)x151 + x124);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x153, &x154, x3,
                                                         (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x155, &x156, x3,
                                                         (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x157, &x158, x3,
                                                         (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x159, &x160, x3,
                                                         (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x161, &x162, 0x0,
                                                              x160, x157);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x163, &x164,
                                                              x162, x158, x155);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x165, &x166,
                                                              x164, x156, x153);
    x167 = (x166 + x154);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x168, &x169, 0x0,
                                                              x144, x159);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x170, &x171,
                                                              x169, x146, x161);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x172, &x173,
                                                              x171, x148, x163);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x174, &x175,
                                                              x173, x150, x165);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x176, &x177,
                                                              x175, x152, x167);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x178, &x179, x168, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x180, &x181, x178, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x182, &x183, x178, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x184, &x185, x178, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x186, &x187, x178, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x188, &x189, 0x0,
                                                              x187, x184);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x190, &x191,
                                                              x189, x185, x182);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x192, &x193,
                                                              x191, x183, x180);
    x194 = (x193 + x181);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x195, &x196, 0x0,
                                                              x168, x186);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x197, &x198,
                                                              x196, x170, x188);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x199, &x200,
                                                              x198, x172, x190);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x201, &x202,
                                                              x200, x174, x192);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x203, &x204,
                                                              x202, x176, x194);
    x205 = ((uint64_t)x204 + x177);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x206, &x207, 0x0, x197, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x208, &x209, x207, x199, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x210, &x211, x209, x201, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x212, &x213, x211, x203, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x214, &x215,
                                                               x213, x205, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x216, x215, x206,
                                                            x197);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x217, x215, x208,
                                                            x199);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x218, x215, x210,
                                                            x201);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x219, x215, x212,
                                                            x203);
    out1[0] = x216;
    out1[1] = x217;
    out1[2] = x218;
    out1[3] = x219;
}